

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int32_t lookup_token(uint8_t *name,size_t namelen)

{
  uint8_t uVar1;
  int iVar2;
  size_t namelen_local;
  uint8_t *name_local;
  
  switch(namelen) {
  case 2:
    if ((name[1] == 'e') && (iVar2 = memeq("t",name,1), iVar2 != 0)) {
      return 0x3d;
    }
    break;
  case 3:
    if (name[2] == 'a') {
      iVar2 = memeq("vi",name,2);
      if (iVar2 != 0) {
        return 0x3b;
      }
    }
    else if ((name[2] == 'e') && (iVar2 = memeq("ag",name,2), iVar2 != 0)) {
      return 0x14;
    }
    break;
  case 4:
    switch(name[3]) {
    case 'e':
      iVar2 = memeq("dat",name,3);
      if (iVar2 != 0) {
        return 0x20;
      }
      break;
    case 'g':
      iVar2 = memeq("eta",name,3);
      if (iVar2 != 0) {
        return 0x21;
      }
      break;
    case 'k':
      iVar2 = memeq("lin",name,3);
      if (iVar2 != 0) {
        return 0x2c;
      }
      break;
    case 'm':
      iVar2 = memeq("fro",name,3);
      if (iVar2 != 0) {
        return 0x24;
      }
      break;
    case 't':
      iVar2 = memeq("hos",name,3);
      if (iVar2 != 0) {
        return 0x25;
      }
      break;
    case 'y':
      iVar2 = memeq("var",name,3);
      if (iVar2 != 0) {
        return 0x3a;
      }
    }
    break;
  case 5:
    uVar1 = name[4];
    if (uVar1 == 'e') {
      iVar2 = memeq("rang",name,4);
      if (iVar2 != 0) {
        return 0x31;
      }
    }
    else if (uVar1 == 'h') {
      iVar2 = memeq(":pat",name,4);
      if (iVar2 != 0) {
        return 3;
      }
    }
    else if ((uVar1 == 'w') && (iVar2 = memeq("allo",name,4), iVar2 != 0)) {
      return 0x15;
    }
    break;
  case 6:
    uVar1 = name[5];
    if (uVar1 == 'e') {
      iVar2 = memeq("cooki",name,5);
      if (iVar2 != 0) {
        return 0x1f;
      }
    }
    else if (uVar1 == 'r') {
      iVar2 = memeq("serve",name,5);
      if (iVar2 != 0) {
        return 0x35;
      }
    }
    else if (uVar1 == 't') {
      iVar2 = memeq("accep",name,5);
      if (iVar2 != 0) {
        return 0x12;
      }
      iVar2 = memeq("expec",name,5);
      if (iVar2 != 0) {
        return 0x22;
      }
    }
    break;
  case 7:
    switch(name[6]) {
    case 'd':
      iVar2 = memeq(":metho",name,6);
      if (iVar2 != 0) {
        return 1;
      }
      break;
    case 'e':
      iVar2 = memeq(":schem",name,6);
      if (iVar2 != 0) {
        return 5;
      }
      iVar2 = memeq("upgrad",name,6);
      if (iVar2 != 0) {
        return 0x41;
      }
      break;
    case 'h':
      iVar2 = memeq("refres",name,6);
      if (iVar2 != 0) {
        return 0x33;
      }
      break;
    case 'r':
      iVar2 = memeq("refere",name,6);
      if (iVar2 != 0) {
        return 0x32;
      }
      break;
    case 's':
      iVar2 = memeq(":statu",name,6);
      if (iVar2 != 0) {
        return 7;
      }
      iVar2 = memeq("expire",name,6);
      if (iVar2 != 0) {
        return 0x23;
      }
    }
    break;
  case 8:
    switch(name[7]) {
    case 'e':
      iVar2 = memeq("if-rang",name,7);
      if (iVar2 != 0) {
        return 0x29;
      }
      break;
    case 'h':
      iVar2 = memeq("if-matc",name,7);
      if (iVar2 != 0) {
        return 0x26;
      }
      break;
    case 'n':
      iVar2 = memeq("locatio",name,7);
      if (iVar2 != 0) {
        return 0x2d;
      }
      break;
    case 'y':
      iVar2 = memeq("priorit",name,7);
      if (iVar2 != 0) {
        return 0x43;
      }
    }
    break;
  case 9:
    if ((name[8] == 'l') && (iVar2 = memeq(":protoco",name,8), iVar2 != 0)) {
      return 0x42;
    }
    break;
  case 10:
    switch(name[9]) {
    case 'e':
      iVar2 = memeq("keep-aliv",name,9);
      if (iVar2 != 0) {
        return 0x3f;
      }
      iVar2 = memeq("set-cooki",name,9);
      if (iVar2 != 0) {
        return 0x36;
      }
      break;
    case 'n':
      iVar2 = memeq("connectio",name,9);
      if (iVar2 != 0) {
        return 0x3e;
      }
      break;
    case 't':
      iVar2 = memeq("user-agen",name,9);
      if (iVar2 != 0) {
        return 0x39;
      }
      break;
    case 'y':
      iVar2 = memeq(":authorit",name,9);
      if (iVar2 != 0) {
        return 0;
      }
    }
    break;
  case 0xb:
    if ((name[10] == 'r') && (iVar2 = memeq("retry-afte",name,10), iVar2 != 0)) {
      return 0x34;
    }
    break;
  case 0xc:
    if (name[0xb] == 'e') {
      iVar2 = memeq("content-typ",name,0xb);
      if (iVar2 != 0) {
        return 0x1e;
      }
    }
    else if ((name[0xb] == 's') && (iVar2 = memeq("max-forward",name,0xb), iVar2 != 0)) {
      return 0x2e;
    }
    break;
  case 0xd:
    switch(name[0xc]) {
    case 'd':
      iVar2 = memeq("last-modifie",name,0xc);
      if (iVar2 != 0) {
        return 0x2b;
      }
      break;
    case 'e':
      iVar2 = memeq("content-rang",name,0xc);
      if (iVar2 != 0) {
        return 0x1d;
      }
      break;
    case 'h':
      iVar2 = memeq("if-none-matc",name,0xc);
      if (iVar2 != 0) {
        return 0x28;
      }
      break;
    case 'l':
      iVar2 = memeq("cache-contro",name,0xc);
      if (iVar2 != 0) {
        return 0x17;
      }
      break;
    case 'n':
      iVar2 = memeq("authorizatio",name,0xc);
      if (iVar2 != 0) {
        return 0x16;
      }
      break;
    case 's':
      iVar2 = memeq("accept-range",name,0xc);
      if (iVar2 != 0) {
        return 0x11;
      }
    }
    break;
  case 0xe:
    if (name[0xd] == 'h') {
      iVar2 = memeq("content-lengt",name,0xd);
      if (iVar2 != 0) {
        return 0x1b;
      }
    }
    else if ((name[0xd] == 't') && (iVar2 = memeq("accept-charse",name,0xd), iVar2 != 0)) {
      return 0xe;
    }
    break;
  case 0xf:
    if (name[0xe] == 'e') {
      iVar2 = memeq("accept-languag",name,0xe);
      if (iVar2 != 0) {
        return 0x10;
      }
    }
    else if ((name[0xe] == 'g') && (iVar2 = memeq("accept-encodin",name,0xe), iVar2 != 0)) {
      return 0xf;
    }
    break;
  case 0x10:
    uVar1 = name[0xf];
    if (uVar1 == 'e') {
      iVar2 = memeq("content-languag",name,0xf);
      if (iVar2 != 0) {
        return 0x1a;
      }
      iVar2 = memeq("www-authenticat",name,0xf);
      if (iVar2 != 0) {
        return 0x3c;
      }
    }
    else if (uVar1 == 'g') {
      iVar2 = memeq("content-encodin",name,0xf);
      if (iVar2 != 0) {
        return 0x19;
      }
    }
    else if (uVar1 == 'n') {
      iVar2 = memeq("content-locatio",name,0xf);
      if (iVar2 != 0) {
        return 0x1c;
      }
      iVar2 = memeq("proxy-connectio",name,0xf);
      if (iVar2 != 0) {
        return 0x40;
      }
    }
    break;
  case 0x11:
    if (name[0x10] == 'e') {
      iVar2 = memeq("if-modified-sinc",name,0x10);
      if (iVar2 != 0) {
        return 0x27;
      }
    }
    else if ((name[0x10] == 'g') && (iVar2 = memeq("transfer-encodin",name,0x10), iVar2 != 0)) {
      return 0x38;
    }
    break;
  case 0x12:
    if ((name[0x11] == 'e') && (iVar2 = memeq("proxy-authenticat",name,0x11), iVar2 != 0)) {
      return 0x2f;
    }
    break;
  case 0x13:
    if (name[0x12] == 'e') {
      iVar2 = memeq("if-unmodified-sinc",name,0x12);
      if (iVar2 != 0) {
        return 0x2a;
      }
    }
    else if (name[0x12] == 'n') {
      iVar2 = memeq("content-dispositio",name,0x12);
      if (iVar2 != 0) {
        return 0x18;
      }
      iVar2 = memeq("proxy-authorizatio",name,0x12);
      if (iVar2 != 0) {
        return 0x30;
      }
    }
    break;
  case 0x19:
    if ((name[0x18] == 'y') && (iVar2 = memeq("strict-transport-securit",name,0x18), iVar2 != 0)) {
      return 0x37;
    }
    break;
  case 0x1b:
    if ((name[0x1a] == 'n') && (iVar2 = memeq("access-control-allow-origi",name,0x1a), iVar2 != 0))
    {
      return 0x13;
    }
  }
  return -1;
}

Assistant:

static int32_t lookup_token(const uint8_t *name, size_t namelen) {
  switch (namelen) {
  case 2:
    switch (name[1]) {
    case 'e':
      if (memeq("t", name, 1)) {
        return NGHTTP2_TOKEN_TE;
      }
      break;
    }
    break;
  case 3:
    switch (name[2]) {
    case 'a':
      if (memeq("vi", name, 2)) {
        return NGHTTP2_TOKEN_VIA;
      }
      break;
    case 'e':
      if (memeq("ag", name, 2)) {
        return NGHTTP2_TOKEN_AGE;
      }
      break;
    }
    break;
  case 4:
    switch (name[3]) {
    case 'e':
      if (memeq("dat", name, 3)) {
        return NGHTTP2_TOKEN_DATE;
      }
      break;
    case 'g':
      if (memeq("eta", name, 3)) {
        return NGHTTP2_TOKEN_ETAG;
      }
      break;
    case 'k':
      if (memeq("lin", name, 3)) {
        return NGHTTP2_TOKEN_LINK;
      }
      break;
    case 'm':
      if (memeq("fro", name, 3)) {
        return NGHTTP2_TOKEN_FROM;
      }
      break;
    case 't':
      if (memeq("hos", name, 3)) {
        return NGHTTP2_TOKEN_HOST;
      }
      break;
    case 'y':
      if (memeq("var", name, 3)) {
        return NGHTTP2_TOKEN_VARY;
      }
      break;
    }
    break;
  case 5:
    switch (name[4]) {
    case 'e':
      if (memeq("rang", name, 4)) {
        return NGHTTP2_TOKEN_RANGE;
      }
      break;
    case 'h':
      if (memeq(":pat", name, 4)) {
        return NGHTTP2_TOKEN__PATH;
      }
      break;
    case 'w':
      if (memeq("allo", name, 4)) {
        return NGHTTP2_TOKEN_ALLOW;
      }
      break;
    }
    break;
  case 6:
    switch (name[5]) {
    case 'e':
      if (memeq("cooki", name, 5)) {
        return NGHTTP2_TOKEN_COOKIE;
      }
      break;
    case 'r':
      if (memeq("serve", name, 5)) {
        return NGHTTP2_TOKEN_SERVER;
      }
      break;
    case 't':
      if (memeq("accep", name, 5)) {
        return NGHTTP2_TOKEN_ACCEPT;
      }
      if (memeq("expec", name, 5)) {
        return NGHTTP2_TOKEN_EXPECT;
      }
      break;
    }
    break;
  case 7:
    switch (name[6]) {
    case 'd':
      if (memeq(":metho", name, 6)) {
        return NGHTTP2_TOKEN__METHOD;
      }
      break;
    case 'e':
      if (memeq(":schem", name, 6)) {
        return NGHTTP2_TOKEN__SCHEME;
      }
      if (memeq("upgrad", name, 6)) {
        return NGHTTP2_TOKEN_UPGRADE;
      }
      break;
    case 'h':
      if (memeq("refres", name, 6)) {
        return NGHTTP2_TOKEN_REFRESH;
      }
      break;
    case 'r':
      if (memeq("refere", name, 6)) {
        return NGHTTP2_TOKEN_REFERER;
      }
      break;
    case 's':
      if (memeq(":statu", name, 6)) {
        return NGHTTP2_TOKEN__STATUS;
      }
      if (memeq("expire", name, 6)) {
        return NGHTTP2_TOKEN_EXPIRES;
      }
      break;
    }
    break;
  case 8:
    switch (name[7]) {
    case 'e':
      if (memeq("if-rang", name, 7)) {
        return NGHTTP2_TOKEN_IF_RANGE;
      }
      break;
    case 'h':
      if (memeq("if-matc", name, 7)) {
        return NGHTTP2_TOKEN_IF_MATCH;
      }
      break;
    case 'n':
      if (memeq("locatio", name, 7)) {
        return NGHTTP2_TOKEN_LOCATION;
      }
      break;
    case 'y':
      if (memeq("priorit", name, 7)) {
        return NGHTTP2_TOKEN_PRIORITY;
      }
      break;
    }
    break;
  case 9:
    switch (name[8]) {
    case 'l':
      if (memeq(":protoco", name, 8)) {
        return NGHTTP2_TOKEN__PROTOCOL;
      }
      break;
    }
    break;
  case 10:
    switch (name[9]) {
    case 'e':
      if (memeq("keep-aliv", name, 9)) {
        return NGHTTP2_TOKEN_KEEP_ALIVE;
      }
      if (memeq("set-cooki", name, 9)) {
        return NGHTTP2_TOKEN_SET_COOKIE;
      }
      break;
    case 'n':
      if (memeq("connectio", name, 9)) {
        return NGHTTP2_TOKEN_CONNECTION;
      }
      break;
    case 't':
      if (memeq("user-agen", name, 9)) {
        return NGHTTP2_TOKEN_USER_AGENT;
      }
      break;
    case 'y':
      if (memeq(":authorit", name, 9)) {
        return NGHTTP2_TOKEN__AUTHORITY;
      }
      break;
    }
    break;
  case 11:
    switch (name[10]) {
    case 'r':
      if (memeq("retry-afte", name, 10)) {
        return NGHTTP2_TOKEN_RETRY_AFTER;
      }
      break;
    }
    break;
  case 12:
    switch (name[11]) {
    case 'e':
      if (memeq("content-typ", name, 11)) {
        return NGHTTP2_TOKEN_CONTENT_TYPE;
      }
      break;
    case 's':
      if (memeq("max-forward", name, 11)) {
        return NGHTTP2_TOKEN_MAX_FORWARDS;
      }
      break;
    }
    break;
  case 13:
    switch (name[12]) {
    case 'd':
      if (memeq("last-modifie", name, 12)) {
        return NGHTTP2_TOKEN_LAST_MODIFIED;
      }
      break;
    case 'e':
      if (memeq("content-rang", name, 12)) {
        return NGHTTP2_TOKEN_CONTENT_RANGE;
      }
      break;
    case 'h':
      if (memeq("if-none-matc", name, 12)) {
        return NGHTTP2_TOKEN_IF_NONE_MATCH;
      }
      break;
    case 'l':
      if (memeq("cache-contro", name, 12)) {
        return NGHTTP2_TOKEN_CACHE_CONTROL;
      }
      break;
    case 'n':
      if (memeq("authorizatio", name, 12)) {
        return NGHTTP2_TOKEN_AUTHORIZATION;
      }
      break;
    case 's':
      if (memeq("accept-range", name, 12)) {
        return NGHTTP2_TOKEN_ACCEPT_RANGES;
      }
      break;
    }
    break;
  case 14:
    switch (name[13]) {
    case 'h':
      if (memeq("content-lengt", name, 13)) {
        return NGHTTP2_TOKEN_CONTENT_LENGTH;
      }
      break;
    case 't':
      if (memeq("accept-charse", name, 13)) {
        return NGHTTP2_TOKEN_ACCEPT_CHARSET;
      }
      break;
    }
    break;
  case 15:
    switch (name[14]) {
    case 'e':
      if (memeq("accept-languag", name, 14)) {
        return NGHTTP2_TOKEN_ACCEPT_LANGUAGE;
      }
      break;
    case 'g':
      if (memeq("accept-encodin", name, 14)) {
        return NGHTTP2_TOKEN_ACCEPT_ENCODING;
      }
      break;
    }
    break;
  case 16:
    switch (name[15]) {
    case 'e':
      if (memeq("content-languag", name, 15)) {
        return NGHTTP2_TOKEN_CONTENT_LANGUAGE;
      }
      if (memeq("www-authenticat", name, 15)) {
        return NGHTTP2_TOKEN_WWW_AUTHENTICATE;
      }
      break;
    case 'g':
      if (memeq("content-encodin", name, 15)) {
        return NGHTTP2_TOKEN_CONTENT_ENCODING;
      }
      break;
    case 'n':
      if (memeq("content-locatio", name, 15)) {
        return NGHTTP2_TOKEN_CONTENT_LOCATION;
      }
      if (memeq("proxy-connectio", name, 15)) {
        return NGHTTP2_TOKEN_PROXY_CONNECTION;
      }
      break;
    }
    break;
  case 17:
    switch (name[16]) {
    case 'e':
      if (memeq("if-modified-sinc", name, 16)) {
        return NGHTTP2_TOKEN_IF_MODIFIED_SINCE;
      }
      break;
    case 'g':
      if (memeq("transfer-encodin", name, 16)) {
        return NGHTTP2_TOKEN_TRANSFER_ENCODING;
      }
      break;
    }
    break;
  case 18:
    switch (name[17]) {
    case 'e':
      if (memeq("proxy-authenticat", name, 17)) {
        return NGHTTP2_TOKEN_PROXY_AUTHENTICATE;
      }
      break;
    }
    break;
  case 19:
    switch (name[18]) {
    case 'e':
      if (memeq("if-unmodified-sinc", name, 18)) {
        return NGHTTP2_TOKEN_IF_UNMODIFIED_SINCE;
      }
      break;
    case 'n':
      if (memeq("content-dispositio", name, 18)) {
        return NGHTTP2_TOKEN_CONTENT_DISPOSITION;
      }
      if (memeq("proxy-authorizatio", name, 18)) {
        return NGHTTP2_TOKEN_PROXY_AUTHORIZATION;
      }
      break;
    }
    break;
  case 25:
    switch (name[24]) {
    case 'y':
      if (memeq("strict-transport-securit", name, 24)) {
        return NGHTTP2_TOKEN_STRICT_TRANSPORT_SECURITY;
      }
      break;
    }
    break;
  case 27:
    switch (name[26]) {
    case 'n':
      if (memeq("access-control-allow-origi", name, 26)) {
        return NGHTTP2_TOKEN_ACCESS_CONTROL_ALLOW_ORIGIN;
      }
      break;
    }
    break;
  }
  return -1;
}